

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrUpdateBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  int iVar2;
  Mio_Library_t *pLib;
  char *pcVar3;
  char *s;
  void *pvVar4;
  Mio_Gate_t *pGate;
  Mio_Pin_t *pPin;
  int i;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pcVar3 = (char *)Vec_PtrEntry(vBox,0);
  iVar1 = strcmp(pcVar3,"Const0T");
  i = 2;
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar2 = strcmp(pcVar3,"Const1T");
    iVar1 = 2;
    if (iVar2 != 0) {
      iVar1 = strcmp(pcVar3,"BufT");
      if (iVar1 == 0) {
        iVar1 = 3;
      }
      else {
        iVar1 = strcmp(pcVar3,"InvT");
        if (iVar1 == 0) {
          iVar1 = 4;
        }
        else {
          iVar1 = strcmp(pcVar3,"AndT");
          if (iVar1 == 0) {
            iVar1 = 5;
          }
          else {
            iVar1 = strcmp(pcVar3,"NandT");
            if (iVar1 == 0) {
              iVar1 = 6;
            }
            else {
              iVar1 = strcmp(pcVar3,"OrT");
              if (iVar1 == 0) {
                iVar1 = 7;
              }
              else {
                iVar1 = strcmp(pcVar3,"NorT");
                if (iVar1 == 0) {
                  iVar1 = 8;
                }
                else {
                  iVar1 = strcmp(pcVar3,"XorT");
                  if (iVar1 == 0) {
                    iVar1 = 9;
                  }
                  else {
                    iVar1 = strcmp(pcVar3,"XnorT");
                    if (iVar1 != 0) {
                      return;
                    }
                    iVar1 = 10;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  s = (char *)Vec_PtrEntry(vGatesNames,iVar1);
  free(pcVar3);
  pcVar3 = Abc_UtilStrsav(s);
  Vec_PtrWriteEntry(vBox,0,pcVar3);
  pvVar4 = Vec_PtrEntry(vBox,1);
  free(pvVar4);
  Vec_PtrWriteEntry(vBox,1,(void *)0x0);
  pGate = Mio_LibraryReadGateByName(pLib,s,(char *)0x0);
  pPin = Mio_GateReadPins(pGate);
  while (pvVar4 = Vec_PtrEntry(vBox,i), pPin != (Mio_Pin_t *)0x0) {
    free(pvVar4);
    pcVar3 = Mio_PinReadName(pPin);
    pcVar3 = Abc_UtilStrsav(pcVar3);
    Vec_PtrWriteEntry(vBox,i,pcVar3);
    pPin = Mio_PinReadNext(pPin);
    i = i + 2;
  }
  pcVar3 = Mio_GateReadOutName(pGate);
  pcVar3 = Abc_UtilStrsav(pcVar3);
  Vec_PtrWriteEntry(vBox,i,pcVar3);
  if (i - vBox->nSize == -2) {
    return;
  }
  __assert_fail("2 * i == Vec_PtrSize(vBox)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtr.c"
                ,0x171,"void Bac_PtrUpdateBox(Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrUpdateBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    Mio_Gate_t * pGate;  Mio_Pin_t * pPin; int i = 1;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    // update gate name
    char * pNameNew, * pName = (char *)Vec_PtrEntry(vBox, 0);
    if ( !strcmp(pName, "Const0T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C0);
    else if ( !strcmp(pName, "Const1T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C1);
    else if ( !strcmp(pName, "BufT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_BUF);
    else if ( !strcmp(pName, "InvT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_INV);
    else if ( !strcmp(pName, "AndT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_AND);
    else if ( !strcmp(pName, "NandT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NAND);
    else if ( !strcmp(pName, "OrT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_OR);
    else if ( !strcmp(pName, "NorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NOR);
    else if ( !strcmp(pName, "XorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XOR);
    else if ( !strcmp(pName, "XnorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XNOR);
    else // user hierarchy
        return;
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 0, Abc_UtilStrsav(pNameNew) );
    // remove instance name
    pName = (char *)Vec_PtrEntry(vBox, 1);
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 1, NULL );
    // update formal input names
    pGate = Mio_LibraryReadGateByName( pLib, pNameNew, NULL );
    Mio_GateForEachPin( pGate, pPin )
    {
        pName = (char *)Vec_PtrEntry( vBox, 2 * i );
        ABC_FREE( pName );
        pNameNew = Mio_PinReadName(pPin);
        Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    }
    // update output name
    pName = (char *)Vec_PtrEntry( vBox, 2 * i );
    pNameNew = Mio_GateReadOutName(pGate);
    Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    assert( 2 * i == Vec_PtrSize(vBox) );
}